

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b(uint8_t *out,void *in,void *key,uint8_t outlen,uint64_t inlen,uint8_t keylen)

{
  int iVar1;
  int iVar2;
  blake2b_state S [1];
  blake2b_state bStack_200;
  
  iVar2 = -1;
  if (out != (uint8_t *)0x0 && in != (void *)0x0) {
    if (keylen == '\0' || key == (void *)0x0) {
      iVar1 = blake2b_init(&bStack_200,outlen);
    }
    else {
      iVar1 = blake2b_init_key(&bStack_200,outlen,key,keylen);
    }
    if (-1 < iVar1) {
      blake2b_update(&bStack_200,(uint8_t *)in,inlen);
      blake2b_final(&bStack_200,out,outlen);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int blake2b( uint8_t *out, const void *in, const void *key, const uint8_t outlen, const uint64_t inlen, uint8_t keylen )
{
  blake2b_state S[1];

  /* Verify parameters */
  if ( NULL == in ) return -1;

  if ( NULL == out ) return -1;

  if( NULL == key ) keylen = 0;

  if( keylen > 0 )
  {
    if( blake2b_init_key( S, outlen, key, keylen ) < 0 ) return -1;
  }
  else
  {
    if( blake2b_init( S, outlen ) < 0 ) return -1;
  }

  blake2b_update( S, ( uint8_t * )in, inlen );
  blake2b_final( S, out, outlen );
  return 0;
}